

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<45UL,_GF2::MOLex<45UL>_> * __thiscall
GF2::MP<45UL,_GF2::MOLex<45UL>_>::operator*=(MP<45UL,_GF2::MOLex<45UL>_> *this,MM<45UL> *mRight)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)this;
  while (p_Var1 = (((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)&p_Var1->_M_next)->
                  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)this) {
    *(ulong *)(p_Var1 + 1) = *(ulong *)(p_Var1 + 1) | (mRight->super_WW<45UL>)._words[0];
  }
  Normalize(this);
  return this;
}

Assistant:

MP& operator*=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end(); ++iter)
			(*iter) *= mRight;
		// при умножении могут появиться повторяющиеся мономы 
		// и может нарушиться порядок
		Normalize();
		return *this;
	}